

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void absl::lts_20240722::container_internal::
     raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  size_t sVar1;
  ulong uVar2;
  Descriptor *pDVar3;
  long lVar4;
  ctrl_t *pcVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  bool bVar17;
  slot_type *ppFVar18;
  ulong uVar19;
  uint64_t v_1;
  byte bVar20;
  size_t sVar21;
  ctrl_t cVar22;
  ulong uVar23;
  FindInfo FVar24;
  HashSetResizeHelper resize_helper;
  undefined1 local_5a;
  undefined1 local_59;
  slot_type *local_58;
  HeapOrSoo local_50;
  size_t local_40;
  byte local_38;
  char local_37;
  undefined1 local_36;
  
  if ((new_capacity == 0) || ((new_capacity + 1 & new_capacity) != 0)) {
    __assert_fail("IsValidCapacity(new_capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe14,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::FieldDescriptor *>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>]"
                 );
  }
  if (new_capacity < 2) {
    __assert_fail("!set->fits_in_soo(new_capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe15,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::FieldDescriptor *>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>]"
                 );
  }
  sVar1 = common->capacity_;
  if (sVar1 == 0) {
    __assert_fail("!kEnabled || cap >= kCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb37,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::FieldDescriptor *>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>]"
                 );
  }
  uVar2 = common->size_;
  bVar20 = 0x80;
  if (1 < uVar2 && sVar1 == 1) {
    ppFVar18 = soo_slot((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         *)common);
    pDVar3 = (*ppFVar18)->containing_type_;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (long)&hash_internal::MixingHashState::kSeed + (long)pDVar3;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = &pDVar3->super_SymbolBase +
                   (SUB168(auVar8 * ZEXT816(0x9ddfea08eb382d69),0) ^
                   SUB168(auVar8 * ZEXT816(0x9ddfea08eb382d69),8));
    auVar10._8_8_ = 0;
    auVar10._0_8_ =
         (SUB168(auVar9 * ZEXT816(0x9ddfea08eb382d69),0) ^
         SUB168(auVar9 * ZEXT816(0x9ddfea08eb382d69),8)) + (ulong)(uint)(*ppFVar18)->number_;
    bVar20 = (SUB161(auVar10 * ZEXT816(0x9ddfea08eb382d69),8) ^
             SUB161(auVar10 * ZEXT816(0x9ddfea08eb382d69),0)) & 0x7f;
  }
  local_40 = common->capacity_;
  local_38 = (byte)common->size_ & 1;
  local_37 = sVar1 == 1;
  local_50._0_4_ = *(undefined4 *)&common->heap_or_soo_;
  local_50._4_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 4);
  local_50._8_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 8);
  local_50._12_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 0xc);
  common->capacity_ = new_capacity;
  local_36 = 1 < uVar2 && sVar1 == 1;
  bVar17 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,8ul,true,true,8ul>
                     ((HashSetResizeHelper *)&local_50,common,&local_59,(int)(char)bVar20,8,8);
  if (local_40 == 0) {
    __assert_fail("resize_helper.old_capacity() > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe38,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::FieldDescriptor *>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>]"
                 );
  }
  if (sVar1 != 1 || 1 < uVar2) {
    local_58 = slot_array((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           *)common);
    if (!bVar17) {
      if (sVar1 == 1) {
        lVar4 = *(long *)(CONCAT44(local_50._4_4_,local_50._0_4_) + 0x20);
        auVar11._8_8_ = 0;
        auVar11._0_8_ = (long)&hash_internal::MixingHashState::kSeed + lVar4;
        auVar12._8_8_ = 0;
        auVar12._0_8_ =
             (SUB168(auVar11 * ZEXT816(0x9ddfea08eb382d69),0) ^
             SUB168(auVar11 * ZEXT816(0x9ddfea08eb382d69),8)) + lVar4;
        auVar13._8_8_ = 0;
        auVar13._0_8_ =
             (SUB168(auVar12 * ZEXT816(0x9ddfea08eb382d69),0) ^
             SUB168(auVar12 * ZEXT816(0x9ddfea08eb382d69),8)) +
             (ulong)*(uint *)(CONCAT44(local_50._4_4_,local_50._0_4_) + 4);
        uVar23 = SUB168(auVar13 * ZEXT816(0x9ddfea08eb382d69),8) ^
                 SUB168(auVar13 * ZEXT816(0x9ddfea08eb382d69),0);
        FVar24 = absl::lts_20240722::container_internal::find_first_non_full<void>(common,uVar23);
        uVar19 = FVar24.offset;
        uVar2 = common->capacity_;
        if (uVar2 <= uVar19) {
LAB_0020003f:
          __assert_fail("i < c.capacity()",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x70c,
                        "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                       );
        }
        cVar22 = (ctrl_t)uVar23 & ~kEmpty;
        pcVar5 = (common->heap_or_soo_).heap.control;
        pcVar5[uVar19] = cVar22;
        pcVar5[(ulong)((uint)uVar2 & 0xf) + (uVar19 - 0xf & uVar2)] = cVar22;
        local_58[uVar19] = (slot_type)CONCAT44(local_50._4_4_,local_50._0_4_);
      }
      else {
        if (local_37 == '\x01') {
          __assert_fail("!was_soo_",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7c2,
                        "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
        }
        if (local_40 != 0) {
          lVar4 = CONCAT44(local_50._12_4_,local_50._8_4_);
          sVar21 = 0;
          do {
            if (local_37 == '\x01') {
              __assert_fail("!was_soo_",
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x7be,
                            "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const"
                           );
            }
            if (-1 < *(char *)(CONCAT44(local_50._4_4_,local_50._0_4_) + sVar21)) {
              lVar6 = *(long *)(lVar4 + sVar21 * 8);
              lVar7 = *(long *)(lVar6 + 0x20);
              auVar14._8_8_ = 0;
              auVar14._0_8_ = (long)&hash_internal::MixingHashState::kSeed + lVar7;
              auVar15._8_8_ = 0;
              auVar15._0_8_ =
                   (SUB168(auVar14 * ZEXT816(0x9ddfea08eb382d69),0) ^
                   SUB168(auVar14 * ZEXT816(0x9ddfea08eb382d69),8)) + lVar7;
              auVar16._8_8_ = 0;
              auVar16._0_8_ =
                   (SUB168(auVar15 * ZEXT816(0x9ddfea08eb382d69),0) ^
                   SUB168(auVar15 * ZEXT816(0x9ddfea08eb382d69),8)) + (ulong)*(uint *)(lVar6 + 4);
              uVar23 = SUB168(auVar16 * ZEXT816(0x9ddfea08eb382d69),8) ^
                       SUB168(auVar16 * ZEXT816(0x9ddfea08eb382d69),0);
              FVar24 = absl::lts_20240722::container_internal::find_first_non_full<void>
                                 (common,uVar23);
              uVar19 = FVar24.offset;
              uVar2 = common->capacity_;
              if (uVar2 <= uVar19) goto LAB_0020003f;
              cVar22 = (ctrl_t)uVar23 & ~kEmpty;
              pcVar5 = (common->heap_or_soo_).heap.control;
              pcVar5[uVar19] = cVar22;
              pcVar5[(ulong)((uint)uVar2 & 0xf) + (uVar19 - 0xf & uVar2)] = cVar22;
              local_58[uVar19] = *(slot_type *)(lVar4 + sVar21 * 8);
            }
            sVar21 = sVar21 + 1;
          } while (sVar21 != local_40);
        }
        if ((common->size_ & 1) != 0) {
          CommonFields::backing_array_start(common);
        }
      }
      if (sVar1 != 1) {
        HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
                  ((HashSetResizeHelper *)&local_50,&local_5a,8);
      }
    }
  }
  return;
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }